

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O2

void __thiscall
QItemDelegate::drawCheck
          (QItemDelegate *this,QPainter *painter,QStyleOptionViewItem *option,QRect *rect,
          CheckState state)

{
  long lVar1;
  QWidget *this_00;
  QStyle *pQVar2;
  long in_FS_OFFSET;
  QStyleOptionViewItem opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((rect->x1).m_i <= (rect->x2).m_i) && ((rect->y1).m_i <= (rect->y2).m_i)) {
    memset(&opt,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem(&opt,option);
    opt.super_QStyleOption.rect.x1.m_i = (rect->x1).m_i;
    opt.super_QStyleOption.rect.y1.m_i = (rect->y1).m_i;
    opt.super_QStyleOption.rect.x2.m_i = (rect->x2).m_i;
    opt.super_QStyleOption.rect.y2.m_i = (rect->y2).m_i;
    opt.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)
         ((uint)opt.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                super_QFlagsStorage<QStyle::StateFlag>.i & 0xfffffeff);
    if (state < (Checked|PartiallyChecked)) {
      opt.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i =
           (QFlagsStorageHelper<QStyle::StateFlag,_4>)
           ((uint)opt.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                  super_QFlagsStorage<QStyle::StateFlag>.i |
           *(uint *)(&DAT_006724b8 + (ulong)state * 4));
    }
    this_00 = option->widget;
    if (this_00 == (QWidget *)0x0) {
      pQVar2 = QApplication::style();
    }
    else {
      pQVar2 = QWidget::style(this_00);
    }
    (**(code **)(*(long *)pQVar2 + 0xb0))(pQVar2,0x19,&opt,painter,this_00);
    QStyleOptionViewItem::~QStyleOptionViewItem(&opt);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QItemDelegate::drawCheck(QPainter *painter,
                              const QStyleOptionViewItem &option,
                              const QRect &rect, Qt::CheckState state) const
{
    Q_D(const QItemDelegate);
    if (!rect.isValid())
        return;

    QStyleOptionViewItem opt(option);
    opt.rect = rect;
    opt.state = opt.state & ~QStyle::State_HasFocus;

    switch (state) {
    case Qt::Unchecked:
        opt.state |= QStyle::State_Off;
        break;
    case Qt::PartiallyChecked:
        opt.state |= QStyle::State_NoChange;
        break;
    case Qt::Checked:
        opt.state |= QStyle::State_On;
        break;
    }

    const QWidget *widget = d->widget(option);
    QStyle *style = widget ? widget->style() : QApplication::style();
    style->drawPrimitive(QStyle::PE_IndicatorItemViewItemCheck, &opt, painter, widget);
}